

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::eval_anyNotEqual_bvec2(ShaderEvalContext *c)

{
  float fVar1;
  ulong uVar2;
  bool bVar3;
  int i;
  long lVar4;
  bool bVar5;
  Vector<bool,_2> res_1;
  Vector<bool,_2> res;
  float local_20 [6];
  ulong local_8;
  
  local_20[0] = c->in[0].m_data[3];
  local_20[1] = c->in[0].m_data[1];
  local_20[4] = 0.0;
  local_20[5] = 0.0;
  res.m_data[0] = false;
  res.m_data[1] = false;
  lVar4 = 0;
  do {
    res.m_data[lVar4] =
         local_20[lVar4 + 4] <= local_20[lVar4] && local_20[lVar4] != local_20[lVar4 + 4];
    lVar4 = lVar4 + 1;
  } while (lVar4 == 1);
  uVar2 = *(ulong *)c->in[1].m_data;
  local_8 = uVar2 << 0x20 | uVar2 >> 0x20;
  local_20[2] = 0.0;
  local_20[3] = 0.0;
  res_1.m_data[0] = false;
  res_1.m_data[1] = false;
  lVar4 = 0;
  do {
    fVar1 = *(float *)((long)&local_8 + lVar4 * 4);
    res_1.m_data[lVar4] = local_20[lVar4 + 2] <= fVar1 && fVar1 != local_20[lVar4 + 2];
    lVar4 = lVar4 + 1;
  } while (lVar4 == 1);
  lVar4 = 0;
  bVar5 = false;
  do {
    bVar3 = !bVar5;
    bVar5 = true;
    if (bVar3) {
      bVar5 = res.m_data[lVar4] != res_1.m_data[lVar4];
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 == 1);
  (c->color).m_data[0] = (float)bVar5;
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }